

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsstyle.cpp
# Opt level: O0

bool __thiscall QWindowsStyle::eventFilter(QWindowsStyle *this,QObject *o,QEvent *e)

{
  bool bVar1;
  byte bVar2;
  Type TVar3;
  int iVar4;
  QWindowsStylePrivate *pQVar5;
  QWidget *this_00;
  const_iterator o_00;
  QEvent *in_RDX;
  QEvent *in_RSI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  QWidget *w_1;
  QList<QMenuBar_*> *__range3_1;
  QWidget *w;
  QList<QWidget_*> *__range3;
  QWindowsStylePrivate *d;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  QList<QMenuBar_*> menuBars;
  const_iterator __end3;
  const_iterator __begin3;
  anon_class_1_0_00000001 ignorable;
  QList<QWidget_*> children;
  QWidget *widget;
  undefined4 in_stack_fffffffffffffef8;
  FindChildOption in_stack_fffffffffffffefc;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  QWidget *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff38;
  QFlagsStorage<Qt::FindChildOption> options;
  bool local_89;
  const_iterator local_70 [2];
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  QWidget **local_48;
  const_iterator local_40;
  const_iterator local_38;
  undefined1 local_2d;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  QWidget *local_10;
  long local_8;
  
  options.i = (Int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QObject::isWidgetType((QObject *)0x4c7f1f);
  if (bVar1) {
    local_10 = qobject_cast<QWidget*>
                         ((QObject *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    pQVar5 = d_func((QWindowsStyle *)0x4c7f5e);
    TVar3 = QEvent::type(in_RDX);
    if (TVar3 == KeyPress) {
      iVar4 = QKeyEvent::key((QKeyEvent *)in_RDX);
      if (iVar4 == 0x1000023) {
        local_10 = QWidget::window(in_stack_ffffffffffffff10);
        local_28 = &DAT_aaaaaaaaaaaaaaaa;
        local_20 = &DAT_aaaaaaaaaaaaaaaa;
        local_18 = &DAT_aaaaaaaaaaaaaaaa;
        QFlags<Qt::FindChildOption>::QFlags
                  ((QFlags<Qt::FindChildOption> *)
                   CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                   in_stack_fffffffffffffefc);
        QObject::findChildren<QWidget*>
                  (&in_stack_ffffffffffffff10->super_QObject,(FindChildOptions)options.i);
        local_2d = 0xaa;
        QList<const_QWidget_*>::append
                  ((QList<const_QWidget_*> *)0x4c8050,
                   (parameter_type)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        pQVar5->alt_down = true;
        local_38.i = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
        local_38 = QList<QWidget_*>::begin
                             ((QList<QWidget_*> *)
                              CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
        local_40.i = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
        local_40 = QList<QWidget_*>::end
                             ((QList<QWidget_*> *)
                              CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
        while( true ) {
          local_48 = local_40.i;
          bVar1 = QList<QWidget_*>::const_iterator::operator!=(&local_38,local_40);
          if (!bVar1) break;
          QList<QWidget_*>::const_iterator::operator*(&local_38);
          bVar1 = eventFilter::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)
                             CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                             (QWidget *)
                             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
          if (!bVar1) {
            QWidget::update((QWidget *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)
                           );
          }
          QList<QWidget_*>::const_iterator::operator++(&local_38);
        }
        QList<QWidget_*>::~QList((QList<QWidget_*> *)0x4c8138);
      }
    }
    else if (TVar3 == KeyRelease) {
      iVar4 = QKeyEvent::key((QKeyEvent *)in_RDX);
      if (iVar4 == 0x1000023) {
        this_00 = QWidget::window(in_stack_ffffffffffffff10);
        pQVar5->alt_down = false;
        local_60 = &DAT_aaaaaaaaaaaaaaaa;
        local_58 = &DAT_aaaaaaaaaaaaaaaa;
        local_50 = &DAT_aaaaaaaaaaaaaaaa;
        local_10 = this_00;
        QFlags<Qt::FindChildOption>::QFlags
                  ((QFlags<Qt::FindChildOption> *)
                   CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                   in_stack_fffffffffffffefc);
        QObject::findChildren<QMenuBar*>(&this_00->super_QObject,(FindChildOptions)options.i);
        local_70[0].i = (QMenuBar **)&DAT_aaaaaaaaaaaaaaaa;
        local_70[0] = QList<QMenuBar_*>::begin
                                ((QList<QMenuBar_*> *)
                                 CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
        o_00 = QList<QMenuBar_*>::end
                         ((QList<QMenuBar_*> *)
                          CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
        while (bVar1 = QList<QMenuBar_*>::const_iterator::operator!=(local_70,o_00), bVar1) {
          QList<QMenuBar_*>::const_iterator::operator*(local_70);
          QWidget::update((QWidget *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
          QList<QMenuBar_*>::const_iterator::operator++(local_70);
        }
        QList<QMenuBar_*>::~QList((QList<QMenuBar_*> *)0x4c829c);
      }
    }
    else if (TVar3 == Close) {
      QList<QWidget_const*>::removeAll<QWidget*>
                ((QList<const_QWidget_*> *)
                 CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                 (QWidget **)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      QWidget::window(in_stack_ffffffffffffff10);
      QList<QWidget_const*>::removeAll<QWidget*>
                ((QList<const_QWidget_*> *)
                 CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                 (QWidget **)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    }
    bVar2 = QObject::eventFilter(in_RDI,in_RSI);
  }
  else {
    bVar2 = QObject::eventFilter(in_RDI,in_RSI);
  }
  local_89 = (bool)(bVar2 & 1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_89;
}

Assistant:

bool QWindowsStyle::eventFilter(QObject *o, QEvent *e)
{
    // Records Alt- and Focus events
    if (!o->isWidgetType())
        return QObject::eventFilter(o, e);

    QWidget *widget = qobject_cast<QWidget*>(o);
    Q_D(QWindowsStyle);
    switch(e->type()) {
    case QEvent::KeyPress:
        if (static_cast<QKeyEvent *>(e)->key() == Qt::Key_Alt) {
            widget = widget->window();

            // Alt has been pressed - find all widgets that care
            const QList<QWidget *> children = widget->findChildren<QWidget *>();
            auto ignorable = [](QWidget *w) {
                return w->isWindow() || !w->isVisible()
                        || w->style()->styleHint(SH_UnderlineShortcut, nullptr, w);
            };
            // Update states before repainting
            d->seenAlt.append(widget);
            d->alt_down = true;

            // Repaint all relevant widgets
            for (QWidget *w : children) {
                if (!ignorable(w))
                    w->update();
            }
        }
        break;
    case QEvent::KeyRelease:
        if (static_cast<QKeyEvent*>(e)->key() == Qt::Key_Alt) {
            widget = widget->window();

            // Update state and repaint the menu bars.
            d->alt_down = false;
#if QT_CONFIG(menubar)
            const QList<QMenuBar *> menuBars = widget->findChildren<QMenuBar *>();
            for (QWidget *w : menuBars)
                w->update();
#endif
        }
        break;
    case QEvent::Close:
        // Reset widget when closing
        d->seenAlt.removeAll(widget);
        d->seenAlt.removeAll(widget->window());
        break;
    default:
        break;
    }
    return QCommonStyle::eventFilter(o, e);
}